

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_contains(run_container_t *run,uint16_t pos)

{
  int32_t iVar1;
  int iVar2;
  int32_t le;
  int32_t offset;
  int32_t index;
  uint16_t pos_local;
  run_container_t *run_local;
  
  iVar1 = interleavedBinarySearch(run->runs,run->n_runs,pos);
  if (iVar1 < 0) {
    iVar2 = -2 - iVar1;
    if ((iVar2 == -1) ||
       ((int)(uint)run->runs[iVar2].length < (int)((uint)pos - (uint)run->runs[iVar2].value))) {
      run_local._7_1_ = false;
    }
    else {
      run_local._7_1_ = true;
    }
  }
  else {
    run_local._7_1_ = true;
  }
  return run_local._7_1_;
}

Assistant:

inline bool run_container_contains(const run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return true;
    index = -index - 2;  // points to preceding value, possibly -1
    if (index != -1) {   // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return true;
    }
    return false;
}